

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_set.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  initializer_list<Color> ilist;
  value_type local_64;
  pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
  local_60;
  set<Color,_std::less<Color>_> color_set;
  
  *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) =
       *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) | 1;
  local_60.first.parent = (set<Color,_std::less<Color>_> *)0x200000001;
  ilist._M_len = 3;
  ilist._M_array = (iterator)&local_60;
  local_60.first.first._0_4_ = BLUE;
  magic_enum::containers::set<Color,_std::less<Color>_>::set(&color_set,ilist);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  color_set.a.a._M_elems[0] = (container_type)(_Type)0x0;
  color_set.s = 0;
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_64 = GREEN;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert(&local_60,&color_set,&local_64);
  local_64 = BLUE;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert(&local_60,&color_set,&local_64);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {

  std::cout << std::boolalpha;
  magic_enum::containers::set color_set {Color::RED, Color::GREEN, Color::BLUE};
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 3

  color_set.clear();
  std::cout << color_set.empty() << std::endl; // true
  std::cout << color_set.size() << std::endl; // 0

  color_set.insert(Color::GREEN);
  color_set.insert(Color::BLUE);
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 2

  return 0;
}